

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration * __thiscall absl::Duration::operator+=(Duration *this,Duration rhs)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = rhs.rep_hi_;
  uVar2 = this->rep_lo_;
  if ((ulong)uVar2 == 0xffffffff) {
    return this;
  }
  uVar3 = rhs.rep_lo_;
  if (uVar3 != 0xffffffff) {
    lVar1 = this->rep_hi_;
    lVar5 = lVar1 + lVar4;
    this->rep_hi_ = lVar5;
    if ((long)(4000000000 - (ulong)uVar3) <= (long)(ulong)uVar2) {
      lVar5 = lVar5 + 1;
      this->rep_hi_ = lVar5;
      uVar2 = uVar2 + 0x1194d800;
    }
    this->rep_lo_ = uVar2 + uVar3;
    if (lVar4 < 0) {
      if (lVar5 <= lVar1) {
        return this;
      }
      lVar4 = -0x8000000000000000;
    }
    else {
      if (lVar1 <= lVar5) {
        return this;
      }
      lVar4 = 0x7fffffffffffffff;
    }
  }
  this->rep_hi_ = lVar4;
  this->rep_lo_ = 0xffffffff;
  return this;
}

Assistant:

Duration& Duration::operator+=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) return *this = rhs;
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) + EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ >= kTicksPerSecond - rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) + 1);
    rep_lo_ -= kTicksPerSecond;
  }
  rep_lo_ += rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ > orig_rep_hi : rep_hi_ < orig_rep_hi) {
    return *this = rhs.rep_hi_ < 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}